

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O2

int run_test_tcp_create_early_bad_bind(void)

{
  int iVar1;
  short *psVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  uv_os_fd_t fd;
  int namelen;
  int count;
  sockaddr_in addr;
  uv_tcp_t client;
  
  iVar1 = uv_interface_addresses(&client,&count);
  if (iVar1 == 0) {
    psVar2 = (short *)((long)client.data + 0x14);
    bVar6 = false;
    for (lVar4 = 0; (!bVar6 && (lVar4 < count)); lVar4 = lVar4 + 1) {
      bVar6 = *psVar2 == 10;
      psVar2 = psVar2 + 0x28;
    }
    uv_free_interface_addresses();
    if (bVar6) {
      iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
      if (iVar1 == 0) {
        uVar3 = uv_default_loop();
        iVar1 = uv_tcp_init_ex(uVar3,&client,10);
        if (iVar1 == 0) {
          iVar1 = uv_fileno(&client,&fd);
          if (iVar1 == 0) {
            if (fd == -1) {
              pcVar5 = "fd != INVALID_FD";
              uVar3 = 0x98;
            }
            else {
              namelen = 0x1c;
              iVar1 = uv_tcp_getsockname(&client,&count);
              if (iVar1 == 0) {
                if ((short)count == 10) {
                  iVar1 = uv_tcp_bind(&client,&addr,0);
                  if (iVar1 == -0x16) {
                    uv_close(&client,0);
                    uVar3 = uv_default_loop();
                    uv_run(uVar3,0);
                    loop = (uv_loop_t *)uv_default_loop();
                    close_loop(loop);
                    uVar3 = uv_default_loop();
                    iVar1 = uv_loop_close(uVar3);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                    uVar3 = 0xb0;
                  }
                  else {
                    pcVar5 = "r == UV_EINVAL";
                    uVar3 = 0xa8;
                  }
                }
                else {
                  pcVar5 = "sockname.sin6_family == AF_INET6";
                  uVar3 = 0xa2;
                }
              }
              else {
                pcVar5 = "r == 0";
                uVar3 = 0xa1;
              }
            }
          }
          else {
            pcVar5 = "r == 0";
            uVar3 = 0x97;
          }
        }
        else {
          pcVar5 = "r == 0";
          uVar3 = 0x94;
        }
      }
      else {
        pcVar5 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
        uVar3 = 0x91;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,uVar3,pcVar5);
      abort();
    }
  }
  fprintf(_stderr,"%s\n","IPv6 not supported");
  fflush(_stderr);
  return 1;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_bind) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET6);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  {
    int namelen;
    struct sockaddr_in6 sockname;
    namelen = sizeof sockname;
    r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
    ASSERT(r == 0);
    ASSERT(sockname.sin6_family == AF_INET6);
  }
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
#if !defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MSYS__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EFAULT);
#endif

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}